

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O3

pair<phmap::priv::raw_hash_set<phmap::priv::FlatHashMapPolicy<cs_impl::any,_cs::statement_block_*>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<std::pair<const_cs_impl::any,_cs::statement_block_*>_>_>::iterator,_bool>
* __thiscall
phmap::priv::
raw_hash_set<phmap::priv::FlatHashMapPolicy<cs_impl::any,cs::statement_block*>,phmap::Hash<cs_impl::any>,phmap::EqualTo<cs_impl::any>,std::allocator<std::pair<cs_impl::any_const,cs::statement_block*>>>
::
emplace_decomposable<cs_impl::any,std::piecewise_construct_t_const&,std::tuple<cs_impl::any_const&>,std::tuple<cs::statement_block*&&>>
          (pair<phmap::priv::raw_hash_set<phmap::priv::FlatHashMapPolicy<cs_impl::any,_cs::statement_block_*>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<std::pair<const_cs_impl::any,_cs::statement_block_*>_>_>::iterator,_bool>
           *__return_storage_ptr__,void *this,any *key,size_t hashval,piecewise_construct_t *args,
          tuple<const_cs_impl::any_&> *args_1,tuple<cs::statement_block_*&&> *args_2)

{
  long lVar1;
  statement_block **ppsVar2;
  proxy *ppVar3;
  size_t i;
  pair<unsigned_long,_bool> pVar4;
  
  pVar4 = raw_hash_set<phmap::priv::FlatHashMapPolicy<cs_impl::any,_cs::statement_block_*>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<std::pair<const_cs_impl::any,_cs::statement_block_*>_>_>
          ::find_or_prepare_insert<cs_impl::any>
                    ((raw_hash_set<phmap::priv::FlatHashMapPolicy<cs_impl::any,_cs::statement_block_*>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<std::pair<const_cs_impl::any,_cs::statement_block_*>_>_>
                      *)this,key,hashval);
  i = pVar4.first;
  if (((undefined1  [16])pVar4 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    lVar1 = *(long *)((long)this + 8);
    ppsVar2 = (args_2->super__Tuple_impl<0UL,_cs::statement_block_*&&>).
              super__Head_base<0UL,_cs::statement_block_*&&,_false>._M_head_impl;
    ppVar3 = ((args_1->super__Tuple_impl<0UL,_const_cs_impl::any_&>).
              super__Head_base<0UL,_const_cs_impl::any_&,_false>._M_head_impl)->mDat;
    if (ppVar3 != (proxy *)0x0) {
      ppVar3->refcount = ppVar3->refcount + 1;
    }
    *(proxy **)(lVar1 + i * 0x10) = ppVar3;
    *(statement_block **)(lVar1 + 8 + i * 0x10) = *ppsVar2;
    raw_hash_set<phmap::priv::FlatHashMapPolicy<cs_impl::any,_cs::statement_block_*>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<std::pair<const_cs_impl::any,_cs::statement_block_*>_>_>
    ::set_ctrl((raw_hash_set<phmap::priv::FlatHashMapPolicy<cs_impl::any,_cs::statement_block_*>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<std::pair<const_cs_impl::any,_cs::statement_block_*>_>_>
                *)this,i,(byte)hashval & 0x7f);
  }
  lVar1 = *(long *)((long)this + 8);
  (__return_storage_ptr__->first).ctrl_ = (ctrl_t *)(*this + i);
  (__return_storage_ptr__->first).field_1.slot_ = (slot_type *)(i * 0x10 + lVar1);
  __return_storage_ptr__->second = pVar4.second;
  return __return_storage_ptr__;
}

Assistant:

std::pair<iterator, bool> emplace_decomposable(const K& key, size_t hashval,
			        Args&&... args)
			{
				auto res = find_or_prepare_insert(key, hashval);
				if (res.second) {
					emplace_at(res.first, std::forward<Args>(args)...);
					this->set_ctrl(res.first, H2(hashval));
				}
				return {iterator_at(res.first), res.second};
			}